

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

BOOL MAPGetRegionInfo(LPVOID lpAddress,PMEMORY_BASIC_INFORMATION lpBuffer)

{
  int iVar1;
  DWORD DVar2;
  CPalThread *pThread;
  LIST_ENTRY *pLVar3;
  LPVOID pvVar4;
  BOOL BVar5;
  
  pThread = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread,&mapping_critsec);
  pLVar3 = &MappedViewList;
  do {
    pLVar3 = pLVar3->Flink;
    if (pLVar3 == &MappedViewList) {
      BVar5 = 0;
      goto LAB_0032afcf;
    }
  } while ((lpAddress < pLVar3[1].Blink) ||
          (pvVar4 = (LPVOID)((long)&(pLVar3[1].Blink)->Flink +
                            (ulong)(*(int *)&pLVar3[2].Flink + 0xfffU & 0xfffff000)),
          pvVar4 <= lpAddress));
  BVar5 = 1;
  if (lpBuffer != (PMEMORY_BASIC_INFORMATION)0x0) {
    lpBuffer->BaseAddress = lpAddress;
    lpBuffer->AllocationProtect = 0;
    lpBuffer->RegionSize = (long)pvVar4 - ((ulong)lpAddress & 0xfffffffffffff000);
    lpBuffer->State = 0x1000;
    iVar1 = *(int *)&pLVar3[2].Blink;
    if (iVar1 == 6) {
      DVar2 = 4;
    }
    else if (iVar1 - 1U < 2) {
      DVar2 = 8;
    }
    else if (iVar1 == 4) {
      DVar2 = 2;
    }
    else if (iVar1 == 0) {
      DVar2 = 1;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","MAPConvertAccessToProtect",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0x6a6);
      fprintf(_stderr,"Unknown flag for flAccess.\n");
      DVar2 = 0xffffffff;
    }
    lpBuffer->Protect = DVar2;
    lpBuffer->Type = 0x40000;
  }
LAB_0032afcf:
  CorUnix::InternalLeaveCriticalSection(pThread,&mapping_critsec);
  return BVar5;
}

Assistant:

BOOL MAPGetRegionInfo(LPVOID lpAddress,
                      PMEMORY_BASIC_INFORMATION lpBuffer)
{
    BOOL fFound = FALSE;
    CPalThread * pThread = InternalGetCurrentThread();
    
    InternalEnterCriticalSection(pThread, &mapping_critsec);

    for(LIST_ENTRY *pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLink->Flink)
    {
        UINT MappedSize;
        VOID * real_map_addr;
        SIZE_T real_map_sz;
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        real_map_addr = pView->pNMHolder->address;
        real_map_sz = pView->pNMHolder->size;
#else
        real_map_addr = pView->lpAddress;
        real_map_sz = pView->NumberOfBytesToMap;
#endif

        MappedSize = ((real_map_sz-1) & ~VIRTUAL_PAGE_MASK) + VIRTUAL_PAGE_SIZE; 
        if ( real_map_addr <= lpAddress && 
             (VOID *)((UINT_PTR)real_map_addr+MappedSize) > lpAddress )
        {
            if (lpBuffer)
            {
                SIZE_T regionSize = MappedSize + (UINT_PTR) real_map_addr - 
                       ((UINT_PTR) lpAddress & ~VIRTUAL_PAGE_MASK);

                lpBuffer->BaseAddress = lpAddress;
                lpBuffer->AllocationProtect = 0;
                lpBuffer->RegionSize = regionSize;
                lpBuffer->State = MEM_COMMIT;
                lpBuffer->Protect = MAPConvertAccessToProtect(pView->dwDesiredAccess);
                lpBuffer->Type = MEM_MAPPED;
            }

            fFound = TRUE;
            break;
        }
    }

    InternalLeaveCriticalSection(pThread, &mapping_critsec);
    
    return fFound;
}